

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

void duckdb::PhysicalCopyToFile::MoveTmpFile(ClientContext *context,string *tmp_file_path)

{
  int iVar1;
  FileSystem *pFVar2;
  string file_path;
  string local_40;
  
  pFVar2 = FileSystem::GetFileSystem(context);
  GetNonTmpFile(&local_40,context,tmp_file_path);
  iVar1 = (*pFVar2->_vptr_FileSystem[0x12])(pFVar2,&local_40,0);
  if ((char)iVar1 != '\0') {
    (*pFVar2->_vptr_FileSystem[0x14])(pFVar2,&local_40,0);
  }
  (*pFVar2->_vptr_FileSystem[0x11])(pFVar2,tmp_file_path,&local_40,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PhysicalCopyToFile::MoveTmpFile(ClientContext &context, const string &tmp_file_path) {
	auto &fs = FileSystem::GetFileSystem(context);
	auto file_path = GetNonTmpFile(context, tmp_file_path);
	if (fs.FileExists(file_path)) {
		fs.RemoveFile(file_path);
	}
	fs.MoveFile(tmp_file_path, file_path);
}